

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

long __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x03'>::value
          (basic_dynamic_counter<long,_(unsigned_char)__x03_> *this,label_key_type labels_value)

{
  _Head_base<0UL,_std::mutex_*,_false> _Var1;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::metric_pair>
  ptr;
  pointer local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  pointer local_10;
  
  local_10 = (pointer)labels_value;
  util::
  map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_hash<137UL>_>
  ::find((map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>::my_hash<137UL>_>
          *)&local_20,
         (key_type *)
         &(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>).map_);
  if (local_20 == (pointer)0x0) {
    _Var1._M_head_impl = (mutex *)0x0;
  }
  else {
    _Var1._M_head_impl =
         local_20[6].mtx_._M_t.super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>.
         _M_t.super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
         super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl;
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return (long)_Var1._M_head_impl;
}

Assistant:

value_type value(label_key_type labels_value) {
    if (auto ptr = Base::find(labels_value); ptr != nullptr) {
      return ptr->value.load(std::memory_order::relaxed);
    }
    else {
      return value_type{};
    }
  }